

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

char * get_contents(char *name)

{
  size_t __n;
  _Bool _Var1;
  int iVar2;
  char *__ptr;
  FILE *__stream;
  size_t size;
  size_t local_20;
  
  if ((name != (char *)0x0) && (*name != '\0')) {
    local_20 = 0;
    _Var1 = get_filesize(name,&local_20);
    __n = local_20;
    if ((_Var1) && (local_20 != 0)) {
      __ptr = (char *)calloc(1,local_20 + 1);
      __stream = fopen(name,"rb");
      if (__stream != (FILE *)0x0) {
        iVar2 = getc(__stream);
        if ((((char)iVar2 != -0x11) || (iVar2 = getc(__stream), (char)iVar2 != -0x45)) ||
           (iVar2 = getc(__stream), (char)iVar2 != -0x41)) {
          fseek(__stream,0,0);
        }
        fread(__ptr,1,__n,__stream);
        fclose(__stream);
        return __ptr;
      }
      free(__ptr);
    }
  }
  return (char *)0x0;
}

Assistant:

char *get_contents(const char *name)
{
	if (name == NULL || strlen(name) == 0)
	{
		return NULL;
	}
	size_t size = 0;
	if (get_filesize(name, &size) == false)
	{
		return NULL;
	}
	if (size == 0)
	{
		return NULL;
	}
	char *buf = (char *)malloc(sizeof(char) * size + 1);
	memset(buf, 0x00, sizeof(char) * size + 1);
	FILE *f = fopen(name, "rb");
	if (f == NULL)
	{
		free(buf);
		return NULL;
	}
	if ((getc(f) & 0xFF) != 0xEF || (getc(f) & 0xFF) != 0xBB || (getc(f) & 0xFF) != 0xBF)
	{
		fseek(f, 0, SEEK_SET);
	}
	size_t  res = fread(buf, sizeof(char), size, f);
	if ( res < size)
	{
		fclose(f);
		return buf;
	}
	fclose(f);
	return buf;
}